

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

int get_rep_len_format_ID(void *format_ID)

{
  uint16_t uVar1;
  uint uVar2;
  byte *in_RDI;
  int rep_len;
  version_3_format_ID *id3;
  
  uVar2 = version_of_format_ID(in_RDI);
  if (uVar2 < 2) {
    printf("Format version %d has no size information \n",(ulong)*in_RDI);
  }
  else {
    if (uVar2 == 2) {
      uVar1 = htons(*(uint16_t *)(in_RDI + 2));
      return ((uint)in_RDI[1] * 0x10000 + (uint)uVar1) * 4;
    }
    printf("Unknown format version %d\n",(ulong)*in_RDI);
  }
  return 0;
}

Assistant:

extern int
get_rep_len_format_ID(void *format_ID)
{
    switch (version_of_format_ID(format_ID)) {
    case 2:{
	    version_3_format_ID *id3 = (version_3_format_ID *) format_ID;
	    int rep_len = htons(id3->rep_len);
	    rep_len += (id3->top_byte_rep_len << 16);
	    return rep_len << 2;
	}
    case 0:
    case 1:
	printf("Format version %d has no size information \n",
	       *((unsigned char *) format_ID));
	break;
    default:
	printf("Unknown format version %d\n",
	       *((unsigned char *) format_ID));
	break;
    }
    return 0;
}